

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteUInt64
               (int field_number,uint64 value,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  uint64 value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_VARINT,output);
  WriteUInt64NoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteUInt64(int field_number, uint64 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteUInt64NoTag(value, output);
}